

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void put2bitbwtile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                  int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t **ppuVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uchar *puVar4;
  uint local_3c;
  uint32_t *puStack_38;
  uint32_t _x;
  uint32_t *bw;
  uint32_t **BWmap;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  ppuVar1 = img->BWmap;
  BWmap._0_4_ = h;
  _y_local = cp;
  do {
    local_3c = w;
    if ((uint32_t)BWmap == 0) {
      return;
    }
    for (; 3 < local_3c; local_3c = local_3c - 4) {
      puVar2 = ppuVar1[*pp];
      *_y_local = *puVar2;
      _y_local[1] = puVar2[1];
      puVar3 = _y_local + 3;
      _y_local[2] = puVar2[2];
      _y_local = _y_local + 4;
      *puVar3 = puVar2[3];
      pp = pp + 1;
    }
    if (local_3c != 0) {
      puVar4 = pp + 1;
      puVar2 = ppuVar1[*pp];
      puStack_38 = puVar2;
      pp = puVar4;
      if (local_3c != 1) {
        if (local_3c != 2) {
          if (local_3c != 3) goto LAB_003dbb2c;
          puStack_38 = puVar2 + 1;
          *_y_local = *puVar2;
          _y_local = _y_local + 1;
        }
        *_y_local = *puStack_38;
        puStack_38 = puStack_38 + 1;
        _y_local = _y_local + 1;
      }
      *_y_local = *puStack_38;
      _y_local = _y_local + 1;
    }
LAB_003dbb2c:
    _y_local = _y_local + toskew;
    pp = pp + fromskew / 4;
    BWmap._0_4_ = (uint32_t)BWmap - 1;
  } while( true );
}

Assistant:

DECLAREContigPutFunc(put2bitbwtile)
{
    uint32_t **BWmap = img->BWmap;

    (void)x;
    (void)y;
    fromskew /= 4;
    for (; h > 0; --h)
    {
        uint32_t *bw;
        UNROLL4(w, bw = BWmap[*pp++], *cp++ = *bw++);
        cp += toskew;
        pp += fromskew;
    }
}